

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> * __thiscall
Json::Reader::getStructuredErrors(Reader *this)

{
  bool bVar1;
  value_type *in_RSI;
  _Self *in_RDI;
  StructuredError structured;
  ErrorInfo *error;
  const_iterator itError;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *allErrors;
  _Self *__x;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
  *in_stack_ffffffffffffff60;
  string local_80 [32];
  reference local_60;
  _Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
  local_38;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::vector
            ((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
              *)0x14c0bd);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::begin
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)in_RDI);
  while( true ) {
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::end
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)in_RDI);
    bVar1 = std::operator!=(__x,in_RDI);
    if (!bVar1) break;
    local_60 = std::
               _Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
               ::operator*(&local_38);
    StructuredError::StructuredError((StructuredError *)0x14c11d);
    std::__cxx11::string::operator=(local_80,(string *)&local_60->message_);
    std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
    push_back(in_stack_ffffffffffffff60,in_RSI);
    StructuredError::~StructuredError((StructuredError *)0x14c181);
    std::
    _Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
    ::operator++(__x);
  }
  return (vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *)
         __x;
}

Assistant:

std::vector<Reader::StructuredError> Reader::getStructuredErrors() const {
  std::vector<Reader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    Reader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}